

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O2

void KYBER_encap_external_entropy
               (uint8_t *out_ciphertext,uint8_t *out_shared_secret,KYBER_public_key *public_key,
               uint8_t *entropy)

{
  uint8_t *randomness;
  uint8_t *len;
  uint8_t *in;
  uint8_t prekey_and_randomness [64];
  uint8_t input [64];
  
  input._0_8_ = *(undefined8 *)entropy;
  input._8_8_ = *(undefined8 *)(entropy + 8);
  input._16_8_ = *(undefined8 *)(entropy + 0x10);
  input._24_8_ = *(undefined8 *)(entropy + 0x18);
  input._32_8_ = *(undefined8 *)((long)&public_key->opaque + 0x620);
  input._40_8_ = *(undefined8 *)((long)&public_key->opaque + 0x628);
  input._48_8_ = *(undefined8 *)((long)&public_key->opaque + 0x630);
  input._56_8_ = *(undefined8 *)((long)&public_key->opaque + 0x638);
  hash_g(prekey_and_randomness,input,0x40);
  randomness = prekey_and_randomness + 0x20;
  len = randomness;
  encrypt_cpa(out_ciphertext,(public_key *)public_key,entropy,randomness);
  hash_h(randomness,out_ciphertext,0x440);
  kdf(out_shared_secret,(size_t)prekey_and_randomness,in,(size_t)len);
  return;
}

Assistant:

void KYBER_encap_external_entropy(
    uint8_t out_ciphertext[KYBER_CIPHERTEXT_BYTES],
    uint8_t out_shared_secret[KYBER_SHARED_SECRET_BYTES],
    const struct KYBER_public_key *public_key,
    const uint8_t entropy[KYBER_ENCAP_ENTROPY]) {
  const struct public_key *pub = public_key_from_external(public_key);
  uint8_t input[64];
  OPENSSL_memcpy(input, entropy, KYBER_ENCAP_ENTROPY);
  OPENSSL_memcpy(input + KYBER_ENCAP_ENTROPY, pub->public_key_hash,
                 sizeof(input) - KYBER_ENCAP_ENTROPY);
  uint8_t prekey_and_randomness[64];
  hash_g(prekey_and_randomness, input, sizeof(input));
  encrypt_cpa(out_ciphertext, pub, entropy, prekey_and_randomness + 32);
  // The ciphertext is public.
  CONSTTIME_DECLASSIFY(out_ciphertext, KYBER_CIPHERTEXT_BYTES);
  hash_h(prekey_and_randomness + 32, out_ciphertext, KYBER_CIPHERTEXT_BYTES);
  kdf(out_shared_secret, KYBER_SHARED_SECRET_BYTES, prekey_and_randomness,
      sizeof(prekey_and_randomness));
}